

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

bool pdqsort_detail::
     partial_insertion_sort<__gnu_cxx::__normal_iterator<FractionalInteger*,std::vector<FractionalInteger,std::allocator<FractionalInteger>>>,HighsTableauSeparator::separateLpSolution(HighsLpRelaxation&,HighsLpAggregator&,HighsTransformedLp&,HighsCutPool&)::__1>
               (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                begin,__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      end,anon_class_8_1_8991fb9c comp)

{
  bool bVar1;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  this;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  *this_00;
  difference_type dVar2;
  T tmp;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  sift_1;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  sift;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  cur;
  size_t limit;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  reference in_stack_ffffffffffffff60;
  reference in_stack_ffffffffffffff68;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_80 [6];
  FractionalInteger *in_stack_ffffffffffffffb0;
  FractionalInteger *in_stack_ffffffffffffffb8;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_38;
  __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
  local_30;
  ulong local_28;
  
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      *)in_stack_ffffffffffffff60,
                     (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff5f,
                                 CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
  if (!bVar1) {
    local_28 = 0;
    local_30 = __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator+((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                               *)CONCAT17(in_stack_ffffffffffffff5f,
                                          CONCAT16(in_stack_ffffffffffffff5e,
                                                   in_stack_ffffffffffffff58))), bVar1) {
      local_38._M_current = local_30._M_current;
      this = __gnu_cxx::
             __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
             ::operator-((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                          *)in_stack_ffffffffffffff68,(difference_type)in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff68 =
           __gnu_cxx::
           __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
           ::operator*(&local_38);
      __gnu_cxx::
      __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
      ::operator*((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                   *)&stack0xffffffffffffffc0);
      bVar1 = HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                        ((anon_class_8_1_8991fb9c *)this._M_current,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0);
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator*(&local_38);
        FractionalInteger::FractionalInteger
                  (in_stack_ffffffffffffff60,
                   (FractionalInteger *)
                   CONCAT17(in_stack_ffffffffffffff5f,
                            CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
        do {
          in_stack_ffffffffffffff60 =
               __gnu_cxx::
               __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
               ::operator*((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)&stack0xffffffffffffffc0);
          local_80[0] = __gnu_cxx::
                        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                        ::operator--((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                      *)in_stack_ffffffffffffff68,
                                     (int)((ulong)in_stack_ffffffffffffff60 >> 0x20));
          __gnu_cxx::
          __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
          ::operator*(local_80);
          FractionalInteger::operator=
                    (in_stack_ffffffffffffff60,
                     (FractionalInteger *)
                     CONCAT17(in_stack_ffffffffffffff5f,
                              CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
          bVar1 = __gnu_cxx::operator!=
                            ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                              *)in_stack_ffffffffffffff60,
                             (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                              *)CONCAT17(in_stack_ffffffffffffff5f,
                                         CONCAT16(in_stack_ffffffffffffff5e,
                                                  in_stack_ffffffffffffff58)));
          in_stack_ffffffffffffff5f = false;
          if (bVar1) {
            this_00 = __gnu_cxx::
                      __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                      ::operator--((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                                    *)&stack0xffffffffffffffc0);
            __gnu_cxx::
            __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
            ::operator*(this_00);
            in_stack_ffffffffffffff5e =
                 HighsTableauSeparator::separateLpSolution::anon_class_8_1_8991fb9c::operator()
                           ((anon_class_8_1_8991fb9c *)this._M_current,in_stack_ffffffffffffffb8,
                            in_stack_ffffffffffffffb0);
            in_stack_ffffffffffffff5f = in_stack_ffffffffffffff5e;
          }
        } while ((bool)in_stack_ffffffffffffff5f != false);
        __gnu_cxx::
        __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
        ::operator*(&local_38);
        FractionalInteger::operator=
                  (in_stack_ffffffffffffff60,
                   (FractionalInteger *)
                   CONCAT17(in_stack_ffffffffffffff5f,
                            CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)));
        dVar2 = __gnu_cxx::operator-
                          ((__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)in_stack_ffffffffffffff60,
                           (__normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff5f,
                                       CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)
                                      ));
        local_28 = dVar2 + local_28;
        FractionalInteger::~FractionalInteger((FractionalInteger *)0x6a88cc);
      }
      if (8 < local_28) {
        return false;
      }
      __gnu_cxx::
      __normal_iterator<FractionalInteger_*,_std::vector<FractionalInteger,_std::allocator<FractionalInteger>_>_>
      ::operator++(&local_30);
    }
  }
  return true;
}

Assistant:

inline bool partial_insertion_sort(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;
        if (begin == end) return true;
        
        std::size_t limit = 0;
        for (Iter cur = begin + 1; cur != end; ++cur) {
            Iter sift = cur;
            Iter sift_1 = cur - 1;

            // Compare first so we can avoid 2 moves for an element already positioned correctly.
            if (comp(*sift, *sift_1)) {
                T tmp = PDQSORT_PREFER_MOVE(*sift);

                do { *sift-- = PDQSORT_PREFER_MOVE(*sift_1); }
                while (sift != begin && comp(tmp, *--sift_1));

                *sift = PDQSORT_PREFER_MOVE(tmp);
                limit += cur - sift;
            }
            
            if (limit > partial_insertion_sort_limit) return false;
        }

        return true;
    }